

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::MeshLoader::loadPositionsSourceElement(MeshLoader *this,InputShared *input)

{
  pointer *ppAVar1;
  MeshVertexData *pMVar2;
  ulong uVar3;
  Semantic *pSVar4;
  Mesh *pMVar5;
  ulong uVar6;
  int iVar7;
  SourceBase *this_00;
  size_t sVar8;
  long *plVar9;
  bool bVar10;
  ulong uVar11;
  Semantic semantic;
  String sourceId;
  URI inputUrl;
  Semantic local_134;
  String local_130;
  URI local_110;
  
  local_134 = (input->super_InputUnshared).mSemantic;
  if (local_134 != POSITION) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The current input element is not a POSITION element!",0x34);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    return false;
  }
  COLLADABU::URI::URI(&local_110,&(input->super_InputUnshared).mSource,false);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_110.mFragment._M_dataplus._M_p,
             local_110.mFragment._M_dataplus._M_p + local_110.mFragment._M_string_length);
  this_00 = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&local_130);
  if (this_00 != (SourceBase *)0x0) {
    uVar3 = (this_00->mLoadedInputElements).mCount;
    if (uVar3 == 0) {
LAB_00804300:
      iVar7 = (*this_00->_vptr_SourceBase[2])(this_00);
      if (iVar7 == 2) {
        pMVar5 = this->mMesh;
        pMVar2 = &pMVar5->mPositions;
        sVar8 = COLLADAFW::FloatOrDoubleArray::getValuesCount(&pMVar2->super_FloatOrDoubleArray);
        this_00->mInitialIndex = sVar8;
        (pMVar5->mPositions).super_FloatOrDoubleArray.mType = DATA_TYPE_FLOAT;
        if (sVar8 == 0) {
          COLLADAFW::FloatOrDoubleArray::setData
                    (&pMVar2->super_FloatOrDoubleArray,
                     *(float **)&this_00[1].mLoadedInputElements.mFlags,
                     (size_t)this_00[1].mAccessor.
                             super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          ppAVar1 = &this_00[1].mAccessor.
                     super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(byte *)ppAVar1 = *(byte *)ppAVar1 & 0xfc;
        }
        else {
          COLLADAFW::FloatOrDoubleArray::appendValues
                    (&pMVar2->super_FloatOrDoubleArray,
                     (FloatArray *)&this_00[1].mLoadedInputElements.mFlags);
        }
        bVar10 = true;
        SourceBase::addLoadedInputElement(this_00,&local_134);
        goto LAB_00804440;
      }
      if (iVar7 == 3) {
        pMVar5 = this->mMesh;
        pMVar2 = &pMVar5->mPositions;
        sVar8 = COLLADAFW::FloatOrDoubleArray::getValuesCount(&pMVar2->super_FloatOrDoubleArray);
        this_00->mInitialIndex = sVar8;
        (pMVar5->mPositions).super_FloatOrDoubleArray.mType = DATA_TYPE_DOUBLE;
        if (sVar8 == 0) {
          COLLADAFW::FloatOrDoubleArray::setData
                    (&pMVar2->super_FloatOrDoubleArray,
                     *(double **)&this_00[1].mLoadedInputElements.mFlags,
                     (size_t)this_00[1].mAccessor.
                             super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          ppAVar1 = &this_00[1].mAccessor.
                     super__Vector_base<COLLADASaxFWL::SourceBase::AccessorParameter,_std::allocator<COLLADASaxFWL::SourceBase::AccessorParameter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(byte *)ppAVar1 = *(byte *)ppAVar1 & 0xfc;
        }
        else {
          COLLADAFW::FloatOrDoubleArray::appendValues
                    (&pMVar2->super_FloatOrDoubleArray,
                     (DoubleArray *)&this_00[1].mLoadedInputElements.mFlags);
        }
        bVar10 = true;
        SourceBase::addLoadedInputElement(this_00,&local_134);
        goto LAB_00804440;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Position source has an other datatype as float or double! ",
                 0x3a);
      plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
    }
    else {
      pSVar4 = (this_00->mLoadedInputElements).mData;
      if (*pSVar4 != POSITION) {
        uVar6 = 1;
        do {
          uVar11 = uVar6;
          if (uVar3 == uVar11) break;
          uVar6 = uVar11 + 1;
        } while (pSVar4[uVar11] != POSITION);
        if (uVar3 <= uVar11) goto LAB_00804300;
      }
    }
  }
  bVar10 = false;
LAB_00804440:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  COLLADABU::URI::~URI(&local_110);
  return bVar10;
}

Assistant:

bool MeshLoader::loadPositionsSourceElement ( const InputShared& input )
    {
        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        if ( semantic != InputSemantic::POSITION )
        {
            std::cerr << "The current input element is not a POSITION element!" << std::endl;
            return false;
        }

        // Get the source element with the uri of the input element.
        COLLADABU::URI inputUrl = input.getSource ();
        String sourceId = inputUrl.getFragment ();
        SourceBase* sourceBase = getSourceById ( sourceId );
        if ( sourceBase == 0 ) return false;
        
        // Check if the source element is already loaded.
        if ( sourceBase->isLoadedInputElement ( semantic ) ) return false;

        // Get the source input array
        const SourceBase::DataType& dataType = sourceBase->getDataType ();
        switch ( dataType )
        {
        case SourceBase::DATA_TYPE_FLOAT:
            {
                // Get the values array from the source
                FloatSource* source = ( FloatSource* ) sourceBase;
                FloatArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<float>& valuesArray = arrayElement.getValues ();

                // TODO
                /* unsigned long long stride = source->getStride (); */ /* UNUSED */

                // Check if there are already some values in the positions list.
                // If so, we have to store the last index to increment the following indexes.
                COLLADAFW::MeshVertexData& positions = mMesh->getPositions ();
                const size_t initialIndex = positions.getValuesCount ();
                sourceBase->setInitialIndex ( initialIndex );

                // Push the new positions into the list of positions.
                positions.setType ( COLLADAFW::MeshVertexData::DATA_TYPE_FLOAT );
                if ( initialIndex != 0 ) 
				{
					positions.appendValues ( valuesArray );
				}
                else
				{
					positions.setData ( valuesArray.getData (), valuesArray.getCount () );
					valuesArray.yieldOwnerShip();
				}

                // Set the source base as loaded element.
                sourceBase->addLoadedInputElement ( semantic );

                break;
            }
        case SourceBase::DATA_TYPE_DOUBLE:
            {
                // Get the values array from the source
                DoubleSource* source = ( DoubleSource* ) sourceBase;
                DoubleArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<double>& valuesArray = arrayElement.getValues ();

                // Check if there are already some values in the positions list.
                // If so, we have to store the last index to increment the following indexes.
                COLLADAFW::MeshVertexData& positions = mMesh->getPositions ();
                const size_t initialIndex = positions.getValuesCount ();
                sourceBase->setInitialIndex ( initialIndex );

                // Push the new positions into the list of positions.
                positions.setType ( COLLADAFW::MeshVertexData::DATA_TYPE_DOUBLE );
                if ( initialIndex != 0 ) 
				{
					positions.appendValues ( valuesArray );
				}
                else 
				{
					positions.setData ( valuesArray.getData (), valuesArray.getCount () );
					valuesArray.yieldOwnerShip();
				}
                
                // Set the source base as loaded element.
                sourceBase->addLoadedInputElement ( semantic );

                break;
            }
        default:
            std::cerr << "Position source has an other datatype as float or double! " << dataType << std::endl;
            return false;
        }

        return true;
    }